

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

OneWayPipe *
kj::newOneWayPipe(OneWayPipe *__return_storage_ptr__,Maybe<unsigned_long> *expectedLength)

{
  uint *puVar1;
  Refcounted *pRVar2;
  unsigned_long uVar3;
  AsyncPipe *pAVar4;
  AsyncInputStream *pAVar5;
  AsyncPipe *pAVar6;
  AsyncOutputStream *pAVar7;
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> local_88;
  Own<kj::AsyncInputStream,_std::nullptr_t> readEnd;
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> local_60;
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> impl;
  Own<kj::(anonymous_namespace)::LimitedInputStream,_std::nullptr_t> local_40;
  
  refcounted<kj::(anonymous_namespace)::AsyncPipe>();
  pAVar4 = impl.ptr;
  puVar1 = &((impl.ptr)->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  pRVar2 = &(impl.ptr)->super_Refcounted;
  local_60.ptr = impl.ptr;
  local_60.disposer = &pRVar2->super_Disposer;
  pAVar5 = (AsyncInputStream *)operator_new(0x20);
  local_60.ptr = (AsyncPipe *)0x0;
  pAVar5->_vptr_AsyncInputStream = (_func_int **)&PTR_read_00675cc0;
  local_88.ptr = (AsyncPipe *)0x0;
  pAVar5[1]._vptr_AsyncInputStream = (_func_int **)pRVar2;
  pAVar5[2]._vptr_AsyncInputStream = (_func_int **)impl.ptr;
  local_88.disposer = &pRVar2->super_Disposer;
  UnwindDetector::UnwindDetector((UnwindDetector *)(pAVar5 + 3));
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t>::~Own(&local_88);
  readEnd.disposer = (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::PipeReadEnd>::instance;
  readEnd.ptr = pAVar5;
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t>::~Own(&local_60);
  if ((expectedLength->ptr).isSet == true) {
    pAVar6 = (AsyncPipe *)operator_new(0x20);
    pAVar5 = readEnd.ptr;
    readEnd.ptr = (AsyncInputStream *)0x0;
    local_88.disposer = readEnd.disposer;
    uVar3 = (expectedLength->ptr).field_1.value;
    (pAVar6->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)&PTR_read_00675d50;
    local_88.ptr = (AsyncPipe *)0x0;
    (pAVar6->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
    _vptr_AsyncOutputStream = (_func_int **)readEnd.disposer;
    (pAVar6->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)pAVar5;
    *(unsigned_long *)&(pAVar6->super_Refcounted).refcount = uVar3;
    if (uVar3 == 0) {
      Own<kj::AsyncInputStream,_std::nullptr_t>::dispose
                ((Own<kj::AsyncInputStream,_std::nullptr_t> *)
                 &(pAVar6->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream)
      ;
    }
    local_40.disposer =
         (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::LimitedInputStream>::instance;
    Own<kj::AsyncInputStream,_std::nullptr_t>::dispose
              ((Own<kj::AsyncInputStream,_std::nullptr_t> *)&local_88);
    local_60.disposer =
         (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::LimitedInputStream>::instance;
    local_40.ptr = (LimitedInputStream *)0x0;
    local_60.ptr = pAVar6;
    Own<kj::AsyncInputStream,_std::nullptr_t>::operator=
              (&readEnd,(Own<kj::AsyncInputStream,_std::nullptr_t> *)&local_60);
    Own<kj::AsyncInputStream,_std::nullptr_t>::dispose
              ((Own<kj::AsyncInputStream,_std::nullptr_t> *)&local_60);
    Own<kj::(anonymous_namespace)::LimitedInputStream,_std::nullptr_t>::~Own(&local_40);
  }
  pAVar7 = (AsyncOutputStream *)operator_new(0x20);
  impl.ptr = (AsyncPipe *)0x0;
  local_88.disposer = impl.disposer;
  pAVar7->_vptr_AsyncOutputStream = (_func_int **)&PTR_write_00675e90;
  local_88.ptr = (AsyncPipe *)0x0;
  pAVar7[1]._vptr_AsyncOutputStream = (_func_int **)impl.disposer;
  pAVar7[2]._vptr_AsyncOutputStream = (_func_int **)pAVar4;
  UnwindDetector::UnwindDetector((UnwindDetector *)(pAVar7 + 3));
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t>::~Own(&local_88);
  local_60.disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::PipeWriteEnd>::instance;
  (__return_storage_ptr__->in).disposer = readEnd.disposer;
  (__return_storage_ptr__->in).ptr = readEnd.ptr;
  readEnd.ptr = (AsyncInputStream *)0x0;
  (__return_storage_ptr__->out).disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::PipeWriteEnd>::instance;
  (__return_storage_ptr__->out).ptr = pAVar7;
  local_60.ptr = (AsyncPipe *)0x0;
  Own<kj::AsyncOutputStream,_std::nullptr_t>::dispose
            ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)&local_60);
  Own<kj::AsyncInputStream,_std::nullptr_t>::dispose(&readEnd);
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t>::~Own(&impl);
  return __return_storage_ptr__;
}

Assistant:

OneWayPipe newOneWayPipe(kj::Maybe<uint64_t> expectedLength) {
  auto impl = kj::refcounted<AsyncPipe>();
  Own<AsyncInputStream> readEnd = kj::heap<PipeReadEnd>(kj::addRef(*impl));
  KJ_IF_SOME(l, expectedLength) {
    readEnd = kj::heap<LimitedInputStream>(kj::mv(readEnd), l);
  }
  Own<AsyncOutputStream> writeEnd = kj::heap<PipeWriteEnd>(kj::mv(impl));
  return { kj::mv(readEnd), kj::mv(writeEnd) };
}